

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O2

void DataRefs::LTSetDebugAcFilter(void *param_1,int i)

{
  bool bVar1;
  string local_28;
  
  if ((uint)i < 0x1000000) {
    if (i == 0) {
      bVar1 = dataRefs.uDebugAcFilter != 0;
      dataRefs.uDebugAcFilter = i;
      if ((bVar1) && ((int)dataRefs.iLogLevel < 3)) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
               ,0x77a,"LTSetDebugAcFilter",logWARN,"DEBUG Filtering for a/c REMOVED");
        return;
      }
    }
    else {
      dataRefs.uDebugAcFilter = i;
      LTSetAcKey(param_1,i);
      if ((int)dataRefs.iLogLevel < 3) {
        GetDebugAcFilter_abi_cxx11_(&local_28,&dataRefs);
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
               ,0x778,"LTSetDebugAcFilter",logWARN,"DEBUG Filtering for a/c \'%s\'",
               local_28._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_28);
      }
    }
  }
  return;
}

Assistant:

void DataRefs::LTSetDebugAcFilter( void* /*inRefcon*/, int i )
{
    bool bWasFilterDefined = dataRefs.uDebugAcFilter != 0;
    
    // match hex range of transpIcao codes
    if ( 0x000000 <= i && (unsigned)i <= MAX_TRANSP_ICAO ) {
        dataRefs.uDebugAcFilter = unsigned(i);
        
        // also set the key for the a/c info datarefs
        if (i > 0x000000) {
            LTSetAcKey(reinterpret_cast<void*>(long(DR_AC_KEY)), i);
            LOG_MSG(logWARN,DBG_FILTER_AC,
                    dataRefs.GetDebugAcFilter().c_str());
        } else if (bWasFilterDefined) {
            LOG_MSG(logWARN,DBG_FILTER_AC_REMOVED);
        }
    }
}